

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteUInt64
               (int field_number,uint64_t value,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteVarint32(output,field_number * 8);
  io::CodedOutputStream::WriteVarint64(output,value);
  return;
}

Assistant:

void WireFormatLite::WriteUInt64(int field_number, uint64_t value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteUInt64NoTag(value, output);
}